

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

void __thiscall sfc::Palette::check_col0_duplicates(Palette *this)

{
  Subpalette *pSVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  Subpalette *sp;
  Subpalette *this_00;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  byte bVar5;
  string_view fmt;
  undefined1 auStack_28 [16];
  
  if ((this->_mode < (gg|snes)) && ((0x18018U >> (this->_mode & (gg|sms)) & 1) != 0)) {
    return;
  }
  this_00 = (this->_subpalettes).
            super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pSVar1) {
    bVar3 = 0;
    do {
      bVar5 = bVar3;
      bVar4 = Subpalette::check_col0_duplicates(this_00);
      this_00 = this_00 + 1;
      bVar3 = bVar5 | bVar4;
    } while (this_00 != pSVar1);
    if (bVar5 != 0 || bVar4) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = auStack_28;
      fmt.size_ = 0x4e;
      fmt.data_ = "Palette contains duplicates of color zero, treating color zero as transparent\n";
      ::fmt::v10::vprint(fmt,(format_args)(auVar2 << 0x40));
    }
  }
  return;
}

Assistant:

void Palette::check_col0_duplicates() {
  if (sfc::col0_is_shared_for_mode(_mode)) {
    bool fixed = false;
    for (auto& sp : _subpalettes)
      fixed |= sp.check_col0_duplicates();
    if (fixed)
      fmt::print("Palette contains duplicates of color zero, treating color zero as transparent\n");
  }
}